

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O0

Value * __thiscall cmFileAPI::AddReplyIndexObject(cmFileAPI *this,Object *o)

{
  bool bVar1;
  Value *pVVar2;
  Value *pVVar3;
  Object *o_00;
  string local_f8;
  string local_d8;
  Value local_b8;
  Value local_90;
  Value local_58;
  Value *local_30;
  Value *object;
  Value *indexEntry;
  Object *o_local;
  cmFileAPI *this_local;
  
  indexEntry = (Value *)o;
  o_local = (Object *)this;
  object = std::
           map<cmFileAPI::Object,_Json::Value,_std::less<cmFileAPI::Object>,_std::allocator<std::pair<const_cmFileAPI::Object,_Json::Value>_>_>
           ::operator[](&this->ReplyIndexObjects,o);
  bVar1 = Json::Value::isNull(object);
  if (bVar1) {
    BuildObject(&local_58,this,(Object *)indexEntry);
    local_30 = &local_58;
    bVar1 = Json::Value::isObject(&local_58);
    if (!bVar1) {
      __assert_fail("object.isObject()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmFileAPI.cxx"
                    ,400,"const Json::Value &cmFileAPI::AddReplyIndexObject(const Object &)");
    }
    Json::Value::Value(&local_90,objectValue);
    Json::Value::operator=(object,&local_90);
    Json::Value::~Value(&local_90);
    pVVar2 = Json::Value::operator[](local_30,"kind");
    pVVar3 = Json::Value::operator[](object,"kind");
    Json::Value::operator=(pVVar3,pVVar2);
    pVVar2 = Json::Value::operator[](local_30,"version");
    pVVar3 = Json::Value::operator[](object,"version");
    Json::Value::operator=(pVVar3,pVVar2);
    pVVar2 = local_30;
    ObjectName_abi_cxx11_(&local_f8,(cmFileAPI *)indexEntry,o_00);
    WriteJsonFile(&local_d8,this,pVVar2,&local_f8,ComputeSuffixHash);
    Json::Value::Value(&local_b8,&local_d8);
    pVVar2 = Json::Value::operator[](object,"jsonFile");
    Json::Value::operator=(pVVar2,&local_b8);
    Json::Value::~Value(&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    this_local = (cmFileAPI *)object;
    Json::Value::~Value(&local_58);
  }
  else {
    this_local = (cmFileAPI *)object;
  }
  return (Value *)this_local;
}

Assistant:

Json::Value const& cmFileAPI::AddReplyIndexObject(Object const& o)
{
  Json::Value& indexEntry = this->ReplyIndexObjects[o];
  if (!indexEntry.isNull()) {
    // The reply object has already been generated.
    return indexEntry;
  }

  // Generate this reply object.
  Json::Value const& object = this->BuildObject(o);
  assert(object.isObject());

  // Populate this index entry.
  indexEntry = Json::objectValue;
  indexEntry["kind"] = object["kind"];
  indexEntry["version"] = object["version"];
  indexEntry["jsonFile"] = this->WriteJsonFile(object, ObjectName(o));
  return indexEntry;
}